

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cabal.c
# Opt level: O1

void spell_web(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  bVar1 = is_safe(ch,(CHAR_DATA *)vo);
  if (bVar1) {
    return;
  }
  bVar1 = saves_spell(level + 5,(CHAR_DATA *)vo,0x10);
  if (!bVar1) {
    iVar2 = number_range(0x14,0x23);
    iVar3 = get_curr_stat((CHAR_DATA *)vo,3);
    if (iVar3 <= iVar2) {
      act("$n releases a sticky web at you, impeding your mobility!",ch,(void *)0x0,vo,2);
      act("$n releases a sticky web at $N!",ch,(void *)0x0,vo,1);
      act("You release a sticky web at $N!",ch,(void *)0x0,vo,3);
      *(short *)((long)vo + 0x162) =
           (short)((uint)(int)(short)(*(short *)((long)vo + 0x162) -
                                     (*(short *)((long)vo + 0x162) >> 0xf)) >> 1);
      iVar2 = number_range(0x1e,0x32);
      damage(ch,(CHAR_DATA *)vo,iVar2,sn,7,true);
      init_affect(&local_90);
      local_90.where = 0;
      local_90.aftype = 3;
      local_90.level = (short)level;
      local_90.location = 2;
      local_90.type = (short)sn;
      iVar2 = number_range(7,0xf);
      local_90.modifier = -(short)iVar2;
      local_90.duration = 3;
      bVar1 = is_affected((CHAR_DATA *)vo,sn);
      if (bVar1) {
        return;
      }
      affect_to_char((CHAR_DATA *)vo,&local_90);
      return;
    }
  }
  act("$n tries to entangle you in a sticky web, but you avoid it.",ch,(void *)0x0,vo,2);
  act("$n tries to entangle $N in a sticky web, but $E avoids it.",ch,(void *)0x0,vo,1);
  act("You try to entangle $N, but $E avoids it.",ch,(void *)0x0,vo,3);
  return;
}

Assistant:

void spell_web(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_safe(ch, victim))
		return;

	if (saves_spell(level + 5, victim, DAM_OTHER) || number_range(20, 35) < get_curr_stat(victim, STAT_DEX))
	{
		act("$n tries to entangle you in a sticky web, but you avoid it.", ch, 0, victim, TO_VICT);
		act("$n tries to entangle $N in a sticky web, but $E avoids it.", ch, 0, victim, TO_NOTVICT);
		act("You try to entangle $N, but $E avoids it.", ch, 0, victim, TO_CHAR);
		return;
	}

	act("$n releases a sticky web at you, impeding your mobility!", ch, 0, victim, TO_VICT);
	act("$n releases a sticky web at $N!", ch, 0, victim, TO_NOTVICT);
	act("You release a sticky web at $N!", ch, 0, victim, TO_CHAR);

	victim->move /= 2;

	damage(ch, victim, number_range(30, 50), sn, DAM_ACID, true);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = sn;
	af.aftype = AFT_MALADY;
	af.level = level;
	af.location = APPLY_DEX;
	af.modifier = -(number_range(7, 15));
	af.duration = 3;

	if (!is_affected(victim, sn))
		affect_to_char(victim, &af);
}